

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

Iterator<false> * __thiscall
bitdeque<32768>::Iterator<false>::operator+=(Iterator<false> *this,difference_type dist)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dist < 1) {
    if (-1 < dist) goto LAB_003c315b;
    lVar3 = -dist;
    if (-(long)this->m_bitpos != dist && this->m_bitpos <= lVar3) {
      std::_Deque_iterator<std::bitset<32768UL>,_std::bitset<32768UL>_&,_std::bitset<32768UL>_*>::
      operator--(&this->m_it);
      lVar3 = lVar3 + ~(long)this->m_bitpos;
      this->m_bitpos = 0x7fff;
    }
    std::_Deque_iterator<std::bitset<32768UL>,_std::bitset<32768UL>_&,_std::bitset<32768UL>_*>::
    operator-=(&this->m_it,lVar3 / 0x8000);
    iVar2 = (int)(lVar3 / 0x8000 << 0xf) - (int)lVar3;
  }
  else {
    if (0x7fff < this->m_bitpos + dist) {
      std::_Deque_iterator<std::bitset<32768UL>,_std::bitset<32768UL>_&,_std::bitset<32768UL>_*>::
      operator++(&this->m_it);
      dist = dist + this->m_bitpos + -0x8000;
      this->m_bitpos = 0;
    }
    std::_Deque_iterator<std::bitset<32768UL>,_std::bitset<32768UL>_&,_std::bitset<32768UL>_*>::
    operator+=(&this->m_it,dist / 0x8000);
    iVar2 = (int)dist - (int)(dist / 0x8000 << 0xf);
  }
  this->m_bitpos = this->m_bitpos + iVar2;
LAB_003c315b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Iterator& operator+=(difference_type dist)
        {
            if (dist > 0) {
                if (dist + m_bitpos >= BITS_PER_WORD) {
                    ++m_it;
                    dist -= BITS_PER_WORD - m_bitpos;
                    m_bitpos = 0;
                }
                auto jump = dist / BITS_PER_WORD;
                m_it += jump;
                m_bitpos += dist - jump * BITS_PER_WORD;
            } else if (dist < 0) {
                dist = -dist;
                if (dist > m_bitpos) {
                    --m_it;
                    dist -= m_bitpos + 1;
                    m_bitpos = BITS_PER_WORD - 1;
                }
                auto jump = dist / BITS_PER_WORD;
                m_it -= jump;
                m_bitpos -= dist - jump * BITS_PER_WORD;
            }
            return *this;
        }